

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O0

void fill_suite::expand_fill_n_full(void)

{
  initializer_list<int> __l;
  size_type sVar1;
  iterator second_begin;
  iterator second_end;
  iterator first_begin;
  iterator first_end;
  allocator<int> local_99;
  int local_98 [4];
  iterator local_88;
  size_type local_80;
  undefined1 local_78 [8];
  vector<int,_std::allocator<int>_> expect;
  int local_4c;
  basic_iterator<int> local_48;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  sVar1 = vista::circular_view<int,_18446744073709551615UL>::capacity
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  vista::circular_view<int,_18446744073709551615UL>::expand_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,sVar1);
  local_48 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  sVar1 = vista::circular_view<int,_18446744073709551615UL>::capacity
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_4c = 0x37;
  join_0x00000010_0x00000000_ =
       std::
       fill_n<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,unsigned_long,int>
                 (local_48,sVar1,&local_4c);
  local_98[0] = 0x37;
  local_98[1] = 0x37;
  local_98[2] = 0x37;
  local_98[3] = 0x37;
  local_88 = local_98;
  local_80 = 4;
  std::allocator<int>::allocator(&local_99);
  __l._M_len = local_80;
  __l._M_array = local_88;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_78,__l,&local_99);
  std::allocator<int>::~allocator(&local_99);
  first_begin = vista::circular_view<int,_18446744073709551615UL>::begin
                          ((circular_view<int,_18446744073709551615UL> *)local_38);
  first_end = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  second_begin = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)local_78);
  second_end = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_78);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x10a,"void fill_suite::expand_fill_n_full()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_end._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_78);
  return;
}

Assistant:

void expand_fill_n_full()
{
    int array[4] = {};
    circular_view<int> span(array);
    span.expand_back(span.capacity());
    std::fill_n(span.begin(), span.capacity(), 55);
    {
        std::vector<int> expect = { 55, 55, 55, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}